

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ClosePopupToLevel(int remaining)

{
  ImGuiContext *pIVar1;
  value_type *pvVar2;
  ImGuiWindow *local_28;
  ImGuiWindow *local_20;
  ImGuiWindow *focus_window;
  ImGuiContext *g;
  int remaining_local;
  
  pIVar1 = GImGui;
  if (-1 < remaining) {
    if (remaining < 1) {
      pvVar2 = ImVector<ImGuiPopupRef>::operator[](&GImGui->OpenPopupStack,0);
      local_28 = pvVar2->ParentWindow;
    }
    else {
      pvVar2 = ImVector<ImGuiPopupRef>::operator[](&GImGui->OpenPopupStack,remaining + -1);
      local_28 = pvVar2->Window;
    }
    local_20 = local_28;
    if (pIVar1->NavLayer == 0) {
      local_20 = NavRestoreLastChildNavWindow(local_28);
    }
    ImGui::FocusWindow(local_20);
    (local_20->DC).NavHideHighlightOneFrame = true;
    ImVector<ImGuiPopupRef>::resize(&pIVar1->OpenPopupStack,remaining);
    return;
  }
  __assert_fail("remaining >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x1391,"void ClosePopupToLevel(int)");
}

Assistant:

static void ClosePopupToLevel(int remaining)
{
    IM_ASSERT(remaining >= 0);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* focus_window = (remaining > 0) ? g.OpenPopupStack[remaining-1].Window : g.OpenPopupStack[0].ParentWindow;
    if (g.NavLayer == 0)
        focus_window = NavRestoreLastChildNavWindow(focus_window);
    ImGui::FocusWindow(focus_window);
    focus_window->DC.NavHideHighlightOneFrame = true;
    g.OpenPopupStack.resize(remaining);
}